

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
* __thiscall
pstore::json::details::eof_matcher<pstore::exchange::import_ns::callbacks>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
           *__return_storage_ptr__,eof_matcher<pstore::exchange::import_ns::callbacks> *this,
          parser<pstore::exchange::import_ns::callbacks> *parser,maybe<char,_void> *ch)

{
  maybe<char,_void> *parser_00;
  bool bVar1;
  bool local_41;
  void *local_40;
  error_code local_38;
  maybe<char,_void> *local_28;
  maybe<char,_void> *ch_local;
  parser<pstore::exchange::import_ns::callbacks> *parser_local;
  eof_matcher<pstore::exchange::import_ns::callbacks> *this_local;
  
  local_28 = ch;
  ch_local = (maybe<char,_void> *)parser;
  parser_local = (parser<pstore::exchange::import_ns::callbacks> *)this;
  this_local = (eof_matcher<pstore::exchange::import_ns::callbacks> *)__return_storage_ptr__;
  bVar1 = pstore::maybe::operator_cast_to_bool((maybe *)ch);
  parser_00 = ch_local;
  if (bVar1) {
    std::error_code::error_code<pstore::json::error_code,void>(&local_38,unexpected_extra_input);
    matcher<pstore::exchange::import_ns::callbacks>::set_error
              (&this->super_matcher<pstore::exchange::import_ns::callbacks>,
               (parser<pstore::exchange::import_ns::callbacks> *)parser_00,&local_38);
  }
  else {
    matcher<pstore::exchange::import_ns::callbacks>::set_state
              (&this->super_matcher<pstore::exchange::import_ns::callbacks>,1);
  }
  local_40 = (void *)0x0;
  local_41 = true;
  std::
  pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
  ::pair<std::nullptr_t,_bool,_true>(__return_storage_ptr__,&local_40,&local_41);
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            eof_matcher<Callbacks>::consume (parser<Callbacks> & parser, maybe<char> const ch) {
                if (ch) {
                    this->set_error (parser, error_code::unexpected_extra_input);
                } else {
                    this->set_state (done_state);
                }
                return {nullptr, true};
            }